

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

Value<char> * __thiscall Qentem::Value<char>::operator=(Value<char> *this,bool is_true)

{
  bool is_true_local;
  Value<char> *this_local;
  
  reset(this);
  if (is_true) {
    setTypeToTrue(this);
  }
  else {
    setTypeToFalse(this);
  }
  return this;
}

Assistant:

Value &operator=(bool is_true) noexcept {
        reset();

        if (is_true) {
            setTypeToTrue();
        } else {
            setTypeToFalse();
        }

        return *this;
    }